

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O0

Pointer<anurbs::BrepTrim> __thiscall
anurbs::Ref<anurbs::BrepTrim>::data(Ref<anurbs::BrepTrim> *this)

{
  __shared_ptr_access<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RSI;
  shared_ptr<anurbs::BrepTrim> sVar1;
  Pointer<anurbs::BrepTrim> PVar2;
  Ref<anurbs::BrepTrim> *this_local;
  
  std::
  __shared_ptr_access<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->(in_RSI);
  sVar1 = Entry<anurbs::BrepTrim>::data((Entry<anurbs::BrepTrim> *)this);
  PVar2.super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar1.super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  PVar2.super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Pointer<anurbs::BrepTrim>)
         PVar2.super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Pointer<TData> data() const
    {
        return m_entry->data();
    }